

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O0

void __thiscall Liby::EventLoopGroup::worker_thread(EventLoopGroup *this,int index)

{
  bool bVar1;
  __shared_ptr_access<Liby::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  EventLoop *pEVar2;
  reference ppEVar3;
  EventLoop *loop_1;
  iterator __end1;
  iterator __begin1;
  vector<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_> *__range1;
  BoolFunctor local_a0;
  anon_class_8_1_8991fb9c local_80;
  RobinFunctor local_78;
  anon_class_8_1_8991fb9c local_48;
  RobinFunctor local_40;
  EventLoop *local_20;
  EventLoop *loop;
  EventLoopGroup *pEStack_10;
  int index_local;
  EventLoopGroup *this_local;
  
  bVar1 = false;
  if (-1 < index) {
    bVar1 = index <= this->n_;
  }
  loop._4_4_ = index;
  pEStack_10 = this;
  if (!bVar1) {
    __assert_fail("index >= 0 && index <= n_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoopGroup.cpp"
                  ,0x26,"void Liby::EventLoopGroup::worker_thread(int)");
  }
  this_00 = (__shared_ptr_access<Liby::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::
            vector<std::shared_ptr<Liby::EventLoop>,_std::allocator<std::shared_ptr<Liby::EventLoop>_>_>
            ::operator[](&this->loops_,(long)index);
  local_20 = std::__shared_ptr_access<Liby::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*(this_00);
  pEVar2 = EventLoop::curr_thread_loop();
  if (pEVar2 == (EventLoop *)0x0) {
    EventLoop::bind_to_thread(local_20);
  }
  pEVar2 = local_20;
  local_48.this = this;
  std::function<Liby::EventLoop*(int)>::function<Liby::EventLoopGroup::worker_thread(int)::__0,void>
            ((function<Liby::EventLoop*(int)> *)&local_40,&local_48);
  EventLoop::setRobinFunctor(pEVar2,&local_40);
  std::function<Liby::EventLoop_*(int)>::~function(&local_40);
  pEVar2 = local_20;
  local_80.this = this;
  std::function<Liby::EventLoop*(int)>::function<Liby::EventLoopGroup::worker_thread(int)::__1,void>
            ((function<Liby::EventLoop*(int)> *)&local_78,&local_80);
  EventLoop::setRobinFunctor1(pEVar2,&local_78);
  std::function<Liby::EventLoop_*(int)>::~function(&local_78);
  pEVar2 = local_20;
  __range1 = (vector<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_> *)this;
  std::function<bool()>::function<Liby::EventLoopGroup::worker_thread(int)::__2,void>
            ((function<bool()> *)&local_a0,(anon_class_8_1_8991fb9c *)&__range1);
  EventLoop::run(pEVar2,&local_a0);
  std::function<bool_()>::~function(&local_a0);
  __end1 = std::vector<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>::begin(&this->ploops_)
  ;
  loop_1 = (EventLoop *)
           std::vector<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>::end(&this->ploops_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Liby::EventLoop_**,_std::vector<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>_>
                                *)&loop_1);
    if (!bVar1) break;
    ppEVar3 = __gnu_cxx::
              __normal_iterator<Liby::EventLoop_**,_std::vector<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>_>
              ::operator*(&__end1);
    EventLoop::wakeup(*ppEVar3);
    __gnu_cxx::
    __normal_iterator<Liby::EventLoop_**,_std::vector<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void EventLoopGroup::worker_thread(int index) {
    assert(index >= 0 && index <= n_);

    EventLoop &loop = *loops_[index];

    if (loop.curr_thread_loop() == nullptr)
        loop.bind_to_thread();

    loop.setRobinFunctor([this](int fd) { return robinLoop(fd); });
    loop.setRobinFunctor1([this](int fd) { return robinLoop1(fd); });

    loop.run([this] {
        static std::mutex m;
        std::lock_guard<std::mutex> G_(m);
        return bf_();
    });

    // 这里不用担心调用wakeup时EventLoopGroup被析构
    //　因为主线程的析构函数会等待其他线程终结

    for (auto loop : ploops_) {
        loop->wakeup();
    }
}